

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  int iVar1;
  Type *pTVar2;
  Type *pTVar3;
  Type *pTVar4;
  Type *pTVar5;
  int i;
  int iVar6;
  FileOptions *pFVar7;
  
  iVar6 = 0;
  while (iVar6 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                       (&(this->message_type_).super_RepeatedPtrFieldBase,iVar6);
    iVar1 = (*(pTVar2->super_Message).super_MessageLite._vptr_MessageLite[5])(pTVar2);
    iVar6 = iVar6 + 1;
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  iVar6 = 0;
  while (iVar6 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                       (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar6);
    iVar1 = (*(pTVar3->super_Message).super_MessageLite._vptr_MessageLite[5])(pTVar3);
    iVar6 = iVar6 + 1;
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  iVar6 = 0;
  while (iVar6 < (this->service_).super_RepeatedPtrFieldBase.current_size_) {
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                       (&(this->service_).super_RepeatedPtrFieldBase,iVar6);
    iVar1 = (*(pTVar4->super_Message).super_MessageLite._vptr_MessageLite[5])(pTVar4);
    iVar6 = iVar6 + 1;
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  iVar6 = 0;
  while (iVar6 < (this->extension_).super_RepeatedPtrFieldBase.current_size_) {
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->extension_).super_RepeatedPtrFieldBase,iVar6);
    iVar1 = (*(pTVar5->super_Message).super_MessageLite._vptr_MessageLite[5])(pTVar5);
    iVar6 = iVar6 + 1;
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  if ((this->_has_bits_[0] & 0x200) != 0) {
    pFVar7 = this->options_;
    if (pFVar7 == (FileOptions *)0x0) {
      pFVar7 = *(FileOptions **)(default_instance_ + 0xb8);
    }
    iVar6 = (*(pFVar7->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((char)iVar6 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {

  for (int i = 0; i < message_type_size(); i++) {
    if (!this->message_type(i).IsInitialized()) return false;
  }
  for (int i = 0; i < enum_type_size(); i++) {
    if (!this->enum_type(i).IsInitialized()) return false;
  }
  for (int i = 0; i < service_size(); i++) {
    if (!this->service(i).IsInitialized()) return false;
  }
  for (int i = 0; i < extension_size(); i++) {
    if (!this->extension(i).IsInitialized()) return false;
  }
  if (has_options()) {
    if (!this->options().IsInitialized()) return false;
  }
  return true;
}